

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall
google::protobuf::DynamicMessage::DynamicMessage(DynamicMessage *this,TypeInfo *type_info)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_004de6a8;
  this->type_info_ = type_info;
  (this->cached_byte_size_).super___atomic_base<int>._M_i = 0;
  SharedCtor(this,true);
  return;
}

Assistant:

DynamicMessage::DynamicMessage(const DynamicMessageFactory::TypeInfo* type_info)
    : type_info_(type_info), cached_byte_size_(0) {
  SharedCtor(true);
}